

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O2

void __thiscall CBlockHeaderAndShortTxIDs::FillShortTxIDSelector(CBlockHeaderAndShortTxIDs *this)

{
  long in_FS_OFFSET;
  uint256 shorttxidhash;
  CSHA256 hasher;
  DataStream local_b8;
  uint64_t local_98;
  uint64_t uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  CSHA256 local_78;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_read_pos = 0;
  local_b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CBlockHeader::SerializationOps<DataStream,CBlockHeader_const,ActionSerialize>(&this->header);
  DataStream::operator<<(&local_b8,&this->nonce);
  CSHA256::CSHA256(&local_78);
  CSHA256::Write(&local_78,
                 local_b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start + local_b8.m_read_pos,
                 (long)local_b8.vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_b8.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_start + local_b8.m_read_pos));
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  CSHA256::Finalize(&local_78,(uchar *)&local_98);
  this->shorttxidk0 = local_98;
  this->shorttxidk1 = uStack_90;
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockHeaderAndShortTxIDs::FillShortTxIDSelector() const {
    DataStream stream{};
    stream << header << nonce;
    CSHA256 hasher;
    hasher.Write((unsigned char*)&(*stream.begin()), stream.end() - stream.begin());
    uint256 shorttxidhash;
    hasher.Finalize(shorttxidhash.begin());
    shorttxidk0 = shorttxidhash.GetUint64(0);
    shorttxidk1 = shorttxidhash.GetUint64(1);
}